

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_buf.c
# Opt level: O1

off_t ngx_chain_coalesce_file(ngx_chain_t **in,off_t limit)

{
  long lVar1;
  ngx_buf_t *pnVar2;
  ngx_buf_t **ppnVar3;
  long lVar4;
  ngx_chain_t *pnVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  
  pnVar5 = *in;
  ppnVar3 = &pnVar5->buf;
  lVar4 = 0;
  do {
    lVar7 = pnVar5->buf->file_pos;
    lVar1 = pnVar5->buf->file_last;
    lVar8 = limit - lVar4;
    if (lVar8 < lVar1 - lVar7) {
      uVar6 = -ngx_pagesize & (lVar8 + lVar7 + ngx_pagesize) - 1;
      lVar7 = uVar6 - lVar7;
      if (lVar1 < (long)uVar6) {
        lVar7 = lVar8;
      }
      lVar4 = lVar4 + lVar7;
LAB_00115e14:
      *in = pnVar5;
      return lVar4;
    }
    lVar4 = lVar4 + (lVar1 - lVar7);
    pnVar5 = pnVar5->next;
    if (pnVar5 == (ngx_chain_t *)0x0) {
      pnVar5 = (ngx_chain_t *)0x0;
      goto LAB_00115e14;
    }
    pnVar2 = pnVar5->buf;
    if (((((pnVar2->field_0x48 & 0x10) == 0) || (limit <= lVar4)) ||
        ((*ppnVar3)->file->fd != pnVar2->file->fd)) || (lVar1 != pnVar2->file_pos))
    goto LAB_00115e14;
  } while( true );
}

Assistant:

off_t
ngx_chain_coalesce_file(ngx_chain_t **in, off_t limit)
{
    off_t         total, size, aligned, fprev;
    ngx_fd_t      fd;
    ngx_chain_t  *cl;

    total = 0;

    cl = *in;
    fd = cl->buf->file->fd;

    do {
        size = cl->buf->file_last - cl->buf->file_pos;

        if (size > limit - total) {
            size = limit - total;

            aligned = (cl->buf->file_pos + size + ngx_pagesize - 1)
                       & ~((off_t) ngx_pagesize - 1);

            if (aligned <= cl->buf->file_last) {
                size = aligned - cl->buf->file_pos;
            }

            total += size;
            break;
        }

        total += size;
        fprev = cl->buf->file_pos + size;
        cl = cl->next;

    } while (cl
             && cl->buf->in_file
             && total < limit
             && fd == cl->buf->file->fd
             && fprev == cl->buf->file_pos);

    *in = cl;

    return total;
}